

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Get_Glyph_Name(FT_Face face,FT_UInt glyph_index,FT_Pointer buffer,FT_UInt buffer_max)

{
  FT_Driver pFVar1;
  FT_Module local_58;
  FT_Module local_50;
  FT_Pointer _tmp_;
  FT_Module module;
  FT_Pointer svc;
  FT_Service_GlyphDict service;
  FT_Error error;
  FT_UInt buffer_max_local;
  FT_Pointer buffer_local;
  FT_UInt glyph_index_local;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if ((buffer == (FT_Pointer)0x0) || (buffer_max == 0)) {
    face_local._4_4_ = 6;
  }
  else {
    *(undefined1 *)buffer = 0;
    if ((long)(ulong)glyph_index < face->num_glyphs) {
      if ((face->face_flags & 0x200U) == 0) {
        face_local._4_4_ = 6;
      }
      else {
        module = (FT_Module)(face->internal->services).service_GLYPH_DICT;
        if (module == (FT_Module)0xfffffffffffffffe) {
          module = (FT_Module)0x0;
        }
        else if (module == (FT_Module)0x0) {
          pFVar1 = face->driver;
          local_50 = (FT_Module)0x0;
          if (((pFVar1->root).clazz)->get_interface != (FT_Module_Requester)0x0) {
            local_50 = (FT_Module)
                       (*((pFVar1->root).clazz)->get_interface)(&pFVar1->root,"glyph-dict");
          }
          module = local_50;
          if (local_50 == (FT_Module)0x0) {
            local_58 = (FT_Module)0xfffffffffffffffe;
          }
          else {
            local_58 = local_50;
          }
          (face->internal->services).service_GLYPH_DICT = local_58;
        }
        if ((module == (FT_Module)0x0) || (module->clazz == (FT_Module_Class *)0x0)) {
          service._0_4_ = 6;
        }
        else {
          service._0_4_ = (*(code *)module->clazz)(face,glyph_index,buffer,buffer_max);
        }
        face_local._4_4_ = (FT_Error)service;
      }
    }
    else {
      face_local._4_4_ = 0x10;
    }
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Glyph_Name( FT_Face     face,
                     FT_UInt     glyph_index,
                     FT_Pointer  buffer,
                     FT_UInt     buffer_max )
  {
    FT_Error              error;
    FT_Service_GlyphDict  service;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !buffer || buffer_max == 0 )
      return FT_THROW( Invalid_Argument );

    /* clean up buffer */
    ((FT_Byte*)buffer)[0] = '\0';

    if ( (FT_Long)glyph_index >= face->num_glyphs )
      return FT_THROW( Invalid_Glyph_Index );

    if ( !FT_HAS_GLYPH_NAMES( face ) )
      return FT_THROW( Invalid_Argument );

    FT_FACE_LOOKUP_SERVICE( face, service, GLYPH_DICT );
    if ( service && service->get_name )
      error = service->get_name( face, glyph_index, buffer, buffer_max );
    else
      error = FT_THROW( Invalid_Argument );

    return error;
  }